

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

void print_usage(char *cmdname)

{
  fprintf(_stderr,
          "Usage: %s [options] <zip file> <directory> ...\nOptions: -d  Use deflate compression only\n         -f  Force creation of archive\n         -u  Only update changed files\n         -q  Do not list files\n"
          ,cmdname);
  return;
}

Assistant:

void print_usage(const char *cmdname)
{
#ifdef _WIN32
	const char *rchar = strrchr(cmdname, '\\');
	if (rchar != NULL)
	{
		cmdname = rchar+1;
	}
#endif
	fprintf(stderr, "Usage: %s [options] <zip file> <directory> ...\n"
					"Options: -d  Use deflate compression only\n"
					"         -f  Force creation of archive\n"
					"         -u  Only update changed files\n"
					"         -q  Do not list files\n", cmdname);
}